

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# populators-inl.h
# Opt level: O3

void __thiscall
spdlog::populators::logger_name_populator::populate
          (logger_name_populator *this,log_msg *msg,json *dest)

{
  value_t t;
  formatter *pfVar1;
  json_value jVar2;
  reference pvVar3;
  pointer *ppuVar4;
  memory_buf_t tmp;
  json_value local_170;
  pointer local_168;
  pointer local_160;
  uchar local_158;
  undefined7 uStack_157;
  _Base_ptr p_Stack_150;
  undefined **local_148;
  undefined1 *local_140;
  long local_138;
  undefined8 local_130;
  undefined1 local_128 [256];
  
  local_138 = 0;
  local_148 = &PTR_grow_00159480;
  local_130 = 0xfa;
  pfVar1 = (this->super_pattern_populator).pf_._M_t.
           super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
           super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
           super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
  local_140 = local_128;
  (*pfVar1->_vptr_formatter[2])(pfVar1,msg,&local_148);
  if (local_138 != 0) {
    local_168 = &local_158;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,local_140,local_140 + local_138);
    local_170.object = (object_t *)0x0;
    local_170.object = (object_t *)operator_new(0x20);
    ppuVar4 = &((local_170.binary)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
     &((local_170.array)->
      super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      )._M_impl)->_M_impl).super__Vector_impl_data._M_start = (pointer)ppuVar4;
    if (local_168 == &local_158) {
      *ppuVar4 = (pointer)CONCAT71(uStack_157,local_158);
      ((local_170.object)->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = p_Stack_150;
    }
    else {
      (((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
       &((local_170.array)->
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
        )._M_impl)->_M_impl).super__Vector_impl_data._M_start = local_168;
      ((local_170.binary)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT71(uStack_157,local_158);
    }
    ((local_170.binary)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = local_160;
    local_160 = (pointer)0x0;
    local_158 = '\0';
    local_168 = &local_158;
    pvVar3 = nlohmann::
             basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
             ::operator[](dest,&(this->super_pattern_populator).kKey);
    t = pvVar3->m_type;
    pvVar3->m_type = string;
    jVar2 = pvVar3->m_value;
    (pvVar3->m_value).binary = (binary_t *)local_170;
    local_170 = jVar2;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::json_value::destroy((json_value *)&local_170.boolean,t);
    if (local_168 != &local_158) {
      operator_delete(local_168);
    }
  }
  if (local_140 != local_128) {
    operator_delete(local_140);
  }
  return;
}

Assistant:

SPDLOG_INLINE void logger_name_populator::populate(const details::log_msg &msg, nlohmann::json &dest)
{
    memory_buf_t tmp;
    pf_->format(msg, tmp);
    if (tmp.size() > 0) {
        dest[kKey] = std::string(tmp.data(), tmp.size());
    }
}